

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall higan::Socket::Accept(Socket *this,InetAddress *address)

{
  int iVar1;
  undefined1 auStack_38 [8];
  sockaddr_in client_addr;
  socklen_t sockaddr_len;
  
  if (address == (InetAddress *)0x0) {
    iVar1 = -1;
  }
  else {
    auStack_38._0_2_ = 0;
    auStack_38._2_2_ = 0;
    auStack_38._4_4_ = 0;
    client_addr.sin_family = 0;
    client_addr.sin_port = 0;
    client_addr.sin_addr.s_addr = 0;
    client_addr.sin_zero[4] = '\x10';
    client_addr.sin_zero[5] = '\0';
    client_addr.sin_zero[6] = '\0';
    client_addr.sin_zero[7] = '\0';
    iVar1 = accept4(this->fd_,(sockaddr *)auStack_38,(socklen_t *)(client_addr.sin_zero + 4),0x80000
                   );
    InetAddress::SetSockaddr(address,(sockaddr_in *)auStack_38);
  }
  return iVar1;
}

Assistant:

int Socket::Accept(InetAddress* address)
{
	if (address == nullptr)
	{
		return -1;
	}

	struct sockaddr_in client_addr{};
	socklen_t sockaddr_len = static_cast<socklen_t>(sizeof client_addr);

	int result_fd = accept4(fd_, reinterpret_cast<sockaddr*>(&client_addr),
			&sockaddr_len, SOCK_CLOEXEC);

	address->SetSockaddr(&client_addr);

	return result_fd;
}